

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O3

double arcsin_pdf(double x,double a)

{
  double dVar1;
  
  dVar1 = 0.0;
  if (0.0 < a) {
    if ((-a < x) && (x < a)) {
      dVar1 = a * a - x * x;
      if (dVar1 < 0.0) {
        dVar1 = sqrt(dVar1);
      }
      else {
        dVar1 = SQRT(dVar1);
      }
      dVar1 = 1.0 / (dVar1 * 3.141592653589793);
    }
    return dVar1;
  }
  std::operator<<((ostream *)&std::cerr,"\n");
  std::operator<<((ostream *)&std::cerr,"ARCSIN_PDF - Fatal error!\n");
  std::operator<<((ostream *)&std::cerr,"  Parameter A <= 0.\n");
  exit(1);
}

Assistant:

double arcsin_pdf ( double x, double a )

//****************************************************************************80
//
//  Purpose:
//
//    ARCSIN_PDF evaluates the Arcsin PDF.
//
//  Discussion:
//
//    The LOGISTIC EQUATION has the form:
//
//      X(N+1) = 4.0 * LAMBDA * ( 1.0 - X(N) ).
//
//    where 0 < LAMBDA <= 1.  This nonlinear difference equation maps
//    the unit interval into itself, and is a simple example of a system
//    exhibiting chaotic behavior.  Ulam and von Neumann studied the
//    logistic equation with LAMBDA = 1, and showed that iterates of the
//    function generated a sequence of pseudorandom numbers with
//    the Arcsin probability density function.
//
//    The derived sequence
//
//      Y(N) = ( 2 / PI ) * Arcsin ( SQRT ( X(N) ) )
//
//    is a pseudorandom sequence with the uniform probability density
//    function on [0,1].  For certain starting values, such as X(0) = 0, 0.75,
//    or 1.0, the sequence degenerates into a constant sequence, and for
//    values very near these, the sequence takes a while before becoming
//    chaotic.
//
//  Formula:
//
//    PDF(X) = 1 / ( PI * Sqrt ( A * A - X * X ) )
//
//  Reference:
//
//    Daniel Zwillinger, Stephen Kokoska,
//    CRC Standard Probability and Statistics Tables and Formulae,
//    Chapman and Hall/CRC, 2000, pages 114-115.
//
//  Modified:
//
//    20 March 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double X, the argument of the PDF.
//    0.0 < X < 1.0.
//
//    Input, double A, the parameter of the CDF.
//    A must be positive.
//
//    Output, double ARCSIN_PDF, the value of the PDF.
//
{
  double pdf;
  const double r8_pi = 3.14159265358979323;

  if ( a <= 0 )
  {
    cerr << "\n";
    cerr << "ARCSIN_PDF - Fatal error!\n";
    cerr << "  Parameter A <= 0.\n";
    exit ( 1 );
  }

  if ( x <= -a || a <= x )
  {
    pdf = 0.0;
  }
  else
  {
    pdf = 1.0 / ( r8_pi * sqrt ( a * a - x * x ) );
  }

  return pdf;
}